

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool mkvmuxer::ChunkedCopy(IMkvReader *source,IMkvWriter *dst,int64_t start,int64_t size)

{
  int iVar1;
  void *pvVar2;
  ulong in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int64_t read_len;
  int64_t offset;
  uint8_t *buf;
  uint32_t kBufSize;
  ulong local_50;
  long local_40;
  ulong local_28;
  
  pvVar2 = operator_new__(0x800);
  local_40 = in_RDX;
  local_28 = in_RCX;
  while( true ) {
    if ((long)local_28 < 1) {
      if (pvVar2 != (void *)0x0) {
        operator_delete__(pvVar2);
      }
      return true;
    }
    if ((long)local_28 < 0x801) {
      local_50 = local_28;
    }
    else {
      local_50 = 0x800;
    }
    iVar1 = (**(code **)*in_RDI)(in_RDI,local_40,local_50,pvVar2);
    if (iVar1 != 0) break;
    (**(code **)*in_RSI)(in_RSI,pvVar2,local_50 & 0xffffffff);
    local_40 = local_50 + local_40;
    local_28 = local_28 - local_50;
  }
  return false;
}

Assistant:

bool ChunkedCopy(mkvparser::IMkvReader* source, mkvmuxer::IMkvWriter* dst,
                 int64_t start, int64_t size) {
  // TODO(vigneshv): Check if this is a reasonable value.
  const uint32_t kBufSize = 2048;
  uint8_t* buf = new uint8_t[kBufSize];
  int64_t offset = start;
  while (size > 0) {
    const int64_t read_len = (size > kBufSize) ? kBufSize : size;
    if (source->Read(offset, static_cast<long>(read_len), buf))
      return false;
    dst->Write(buf, static_cast<uint32_t>(read_len));
    offset += read_len;
    size -= read_len;
  }
  delete[] buf;
  return true;
}